

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int cmsysProcess_WaitForData(cmsysProcess *cp,char **data,int *length,double *userTimeout)

{
  fd_set *__readfds;
  uint uVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  timeval *__timeout;
  __pid_t _Var5;
  int iVar6;
  ssize_t sVar7;
  int *piVar8;
  __time_t _Var9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  double dVar16;
  timespec current_timespec;
  sigset_t old_mask;
  int local_1d4;
  double *local_1d0;
  int iStack_1b4;
  kwsysProcessTime kStack_1a0;
  ulong local_190;
  long local_188;
  char **local_180;
  int *local_178;
  long local_170;
  char *local_168;
  double *local_160;
  long local_158;
  timeval *local_150;
  int *local_148;
  timeval local_140;
  sigset_t local_130;
  sigset_t local_b0;
  
  kStack_1a0.tv_sec = 0;
  bVar3 = false;
  iStack_1b4 = 0;
  kStack_1a0.tv_usec = 0;
  if ((((cp != (cmsysProcess *)0x0) && (cp->State == 3)) && (cp->Killed == 0)) &&
     (cp->TimeoutExpired == 0)) {
    local_180 = data;
    local_178 = length;
    local_160 = userTimeout;
    if (userTimeout == (double *)0x0) {
      local_188 = 0;
      local_1d4 = kwsysProcessGetTimeoutTime(cp,(double *)0x0,&kStack_1a0);
      local_190 = 0;
    }
    else {
      clock_gettime(1,(timespec *)&local_130);
      lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_130.__val[1]),8);
      local_190 = local_130.__val[0];
      local_188 = (lVar11 >> 7) - (lVar11 >> 0x3f);
      local_1d4 = kwsysProcessGetTimeoutTime(cp,userTimeout,&kStack_1a0);
    }
    if (0 < cp->PipesLeft) {
      bVar14 = local_180 == (char **)0x0;
      bVar15 = local_178 == (int *)0x0;
      local_170 = kStack_1a0.tv_sec;
      local_1d0 = (double *)0x0;
      local_150 = &local_140;
      if (kStack_1a0.tv_sec < 0) {
        local_150 = (timeval *)0x0;
      }
      if (local_1d4 != 0) {
        local_1d0 = userTimeout;
      }
      __readfds = &cp->PipeSet;
      local_148 = &cp->SignalPipe;
      local_168 = cp->ErrorMessage;
      local_158 = kStack_1a0.tv_usec;
      do {
        lVar11 = 0;
        do {
          uVar13 = cp->PipeReadEnds[lVar11];
          if (-1 < (int)uVar13) {
            if (((ulong)__readfds->__fds_bits[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) != 0) {
              __readfds->__fds_bits[uVar13 >> 6] =
                   __readfds->__fds_bits[uVar13 >> 6] & ~(1L << ((byte)uVar13 & 0x3f));
              do {
                sVar7 = read(cp->PipeReadEnds[lVar11],cp->PipeBuffer,0x400);
                if (-1 < sVar7) {
                  if (sVar7 == 0) goto LAB_003e2d71;
                  if (lVar11 == 2) {
                    sigemptyset(&local_130);
                    sigaddset(&local_130,2);
                    sigaddset(&local_130,0xf);
                    iVar6 = sigprocmask(0,&local_130,&local_b0);
                    if (-1 < iVar6) {
                      if (0 < cp->NumberOfCommands) {
                        lVar12 = 0;
                        do {
                          if (cp->ForkPIDs[lVar12] != 0) {
                            do {
                              _Var5 = waitpid(cp->ForkPIDs[lVar12],cp->CommandExitCodes + lVar12,1);
                              if (-1 < _Var5) {
                                if (_Var5 != 0) {
                                  cp->ForkPIDs[lVar12] = 0;
                                  piVar8 = &cp->CommandsLeft;
                                  *piVar8 = *piVar8 + -1;
                                  if (*piVar8 == 0) {
                                    kwsysProcessCleanupDescriptor(local_148);
                                  }
                                }
                                goto LAB_003e2d4b;
                              }
                              piVar8 = __errno_location();
                            } while (*piVar8 == 4);
                            if (cp->State != 1) {
                              pcVar10 = strerror(*piVar8);
                              strncpy(local_168,pcVar10,0x400);
                              cp->State = 1;
                            }
                          }
LAB_003e2d4b:
                          lVar12 = lVar12 + 1;
                        } while (lVar12 < cp->NumberOfCommands);
                      }
                      sigprocmask(2,&local_b0,(sigset_t *)0x0);
                    }
                    goto LAB_003e2d7f;
                  }
                  if (bVar14 || bVar15) goto LAB_003e2d7f;
                  *local_180 = cp->PipeBuffer;
                  *local_178 = (int)sVar7;
                  if ((int)lVar11 == 1) {
                    bVar3 = false;
                    iStack_1b4 = 3;
                  }
                  else if ((int)lVar11 == 0) {
                    bVar3 = false;
                    iStack_1b4 = 2;
                  }
                  goto LAB_003e2f6d;
                }
                piVar8 = __errno_location();
              } while (*piVar8 == 4);
              if (*piVar8 != 0xb) {
LAB_003e2d71:
                kwsysProcessCleanupDescriptor(cp->PipeReadEnds + lVar11);
                cp->PipesLeft = cp->PipesLeft + -1;
              }
            }
          }
LAB_003e2d7f:
          __timeout = local_150;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        (cp->PipeSet).__fds_bits[0xe] = 0;
        (cp->PipeSet).__fds_bits[0xf] = 0;
        (cp->PipeSet).__fds_bits[0xc] = 0;
        (cp->PipeSet).__fds_bits[0xd] = 0;
        (cp->PipeSet).__fds_bits[10] = 0;
        (cp->PipeSet).__fds_bits[0xb] = 0;
        (cp->PipeSet).__fds_bits[8] = 0;
        (cp->PipeSet).__fds_bits[9] = 0;
        (cp->PipeSet).__fds_bits[6] = 0;
        (cp->PipeSet).__fds_bits[7] = 0;
        (cp->PipeSet).__fds_bits[4] = 0;
        (cp->PipeSet).__fds_bits[5] = 0;
        (cp->PipeSet).__fds_bits[2] = 0;
        (cp->PipeSet).__fds_bits[3] = 0;
        __readfds->__fds_bits[0] = 0;
        (cp->PipeSet).__fds_bits[1] = 0;
        _Var9 = local_140.tv_sec;
        lVar11 = local_140.tv_usec;
        if (-1 < local_170) {
          clock_gettime(1,(timespec *)&local_130);
          lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_130.__val[1]),8);
          lVar12 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_158;
          _Var9 = (lVar12 >> 0x3f) + (local_170 - local_130.__val[0]);
          if ((local_1d0 == (double *)0x0) || (-1 < _Var9)) {
            lVar11 = lVar12 + 1000000;
            if (-1 < lVar12) {
              lVar11 = lVar12;
            }
            if (-1 < _Var9) goto LAB_003e2e92;
          }
          else if (*local_1d0 <= 0.0) {
            _Var9 = 0;
            lVar11 = 0;
            goto LAB_003e2e92;
          }
LAB_003e2f5b:
          bVar3 = true;
          iStack_1b4 = 0;
          break;
        }
LAB_003e2e92:
        local_140.tv_usec = lVar11;
        local_140.tv_sec = _Var9;
        uVar13 = 0xffffffff;
        lVar11 = 3;
        do {
          uVar1 = cp->PipeReadEnds[lVar11 + -3];
          if ((-1 < (int)uVar1) &&
             (__readfds->__fds_bits[uVar1 >> 6] =
                   __readfds->__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f),
             (int)uVar13 < (int)uVar1)) {
            uVar13 = uVar1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 6);
        if ((int)uVar13 < 0) break;
        do {
          iVar6 = select(uVar13 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,__timeout);
          if (-1 < iVar6) {
            if (iVar6 != 0) goto LAB_003e2f2a;
            goto LAB_003e2f5b;
          }
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        pcVar10 = strerror(*piVar8);
        strncpy(local_168,pcVar10,0x400);
        cmsysProcess_Kill(cp);
        cp->Killed = 0;
        cp->SelectError = 1;
LAB_003e2f2a:
      } while (0 < cp->PipesLeft);
    }
LAB_003e2f6d:
    pdVar4 = local_160;
    if (local_160 != (double *)0x0) {
      clock_gettime(1,(timespec *)&local_130);
      lVar11 = (long)local_130.__val[1] / 1000 + local_188;
      lVar12 = local_188 + 1000000 + (long)local_130.__val[1] / 1000;
      if (-1 < lVar11) {
        lVar12 = lVar11;
      }
      dVar2 = *pdVar4 - ((double)lVar12 * 1e-06 +
                        (double)(long)((lVar11 >> 0x3f) + (local_130.__val[0] - local_190)));
      dVar16 = 0.0;
      if (0.0 <= dVar2) {
        dVar16 = dVar2;
      }
      *pdVar4 = dVar16;
    }
    if (iStack_1b4 != 0) {
      return iStack_1b4;
    }
    if (bVar3) {
      if (local_1d4 != 0) {
        return 0xff;
      }
      cmsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
    }
  }
  return 0;
}

Assistant:

int kwsysProcess_WaitForData(kwsysProcess* cp, char** data, int* length,
                             double* userTimeout)
{
  kwsysProcessTime userStartTime = { 0, 0 };
  kwsysProcessWaitData wd = { 0, kwsysProcess_Pipe_None, 0, 0, { 0, 0 } };
  wd.UserTimeout = userTimeout;
  /* Make sure we are executing a process.  */
  if (!cp || cp->State != kwsysProcess_State_Executing || cp->Killed ||
      cp->TimeoutExpired) {
    return kwsysProcess_Pipe_None;
  }

  /* Record the time at which user timeout period starts.  */
  if (userTimeout) {
    userStartTime = kwsysProcessTimeGetCurrent();
  }

  /* Calculate the time at which a timeout will expire, and whether it
     is the user or process timeout.  */
  wd.User = kwsysProcessGetTimeoutTime(cp, userTimeout, &wd.TimeoutTime);

  /* Data can only be available when pipes are open.  If the process
     is not running, cp->PipesLeft will be 0.  */
  while (cp->PipesLeft > 0 &&
         !kwsysProcessWaitForPipe(cp, data, length, &wd)) {
  }

  /* Update the user timeout.  */
  if (userTimeout) {
    kwsysProcessTime userEndTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime difference =
      kwsysProcessTimeSubtract(userEndTime, userStartTime);
    double d = kwsysProcessTimeToDouble(difference);
    *userTimeout -= d;
    if (*userTimeout < 0) {
      *userTimeout = 0;
    }
  }

  /* Check what happened.  */
  if (wd.PipeId) {
    /* Data are ready on a pipe.  */
    return wd.PipeId;
  } else if (wd.Expired) {
    /* A timeout has expired.  */
    if (wd.User) {
      /* The user timeout has expired.  It has no time left.  */
      return kwsysProcess_Pipe_Timeout;
    } else {
      /* The process timeout has expired.  Kill the children now.  */
      kwsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
      return kwsysProcess_Pipe_None;
    }
  } else {
    /* No pipes are left open.  */
    return kwsysProcess_Pipe_None;
  }
}